

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcemanager.cpp
# Opt level: O0

void __thiscall
ResourceManager::addShader(ResourceManager *this,GLuint program,string *vtShader,string *fragShader)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [32];
  string *local_28;
  string *fragShader_local;
  string *vtShader_local;
  ResourceManager *pRStack_10;
  GLuint program_local;
  ResourceManager *this_local;
  
  local_28 = fragShader;
  fragShader_local = vtShader;
  vtShader_local._4_4_ = program;
  pRStack_10 = this;
  std::operator+(local_68,(char *)vtShader);
  std::operator+(local_48,local_68);
  std::
  map<std::__cxx11::string,unsigned_int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
  ::emplace<std::__cxx11::string,unsigned_int&>
            ((map<std::__cxx11::string,unsigned_int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
              *)&this->loadedShaders,local_48,(uint *)((long)&vtShader_local + 4));
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void ResourceManager::addShader(GLuint program, std::string vtShader, std::string fragShader)
{
	loadedShaders.emplace((vtShader + "," + fragShader), program);
}